

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

void __thiscall ForStatement::print(ForStatement *this)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"for ",4);
  (**this->_id->_vptr_ExprNode)();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," in range(",10);
  Testlist::print(this->_testlist);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,") :",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"     ",5);
  Statements::print(this->_stmts);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
  return;
}

Assistant:

void ForStatement::print() {

    std::cout << "for ";
    _id->print();
    std::cout << " in range(";
    _testlist->print();
    std::cout << ") :" << std::endl;
    std::cout << "     ";
    _stmts->print();
    std::cout << "";

}